

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressiontoken.cpp
# Opt level: O0

int __thiscall PDA::Transducer::ExpressionToken::getPriority(ExpressionToken *this)

{
  ExpressionToken *this_local;
  
  if (this->m_charToken == L';') {
    this_local._4_4_ = 1;
  }
  else if ((this->m_charToken == L'-') || (this->m_charToken == L'+')) {
    this_local._4_4_ = 2;
  }
  else if ((this->m_charToken == L'*') ||
          ((this->m_charToken == L'/' || (this->m_charToken == L'%')))) {
    this_local._4_4_ = 3;
  }
  else if ((this->m_charToken == L')') || (this->m_charToken == L'(')) {
    if ((this->m_braceType == Priority) || (this->m_braceType == Unassigned)) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 4;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int ExpressionToken::getPriority() const
{
    if (m_charToken == L';')
        return 1;
    else if (m_charToken == L'-' || m_charToken == L'+')
        return 2;
    else if (m_charToken == L'*' || m_charToken == L'/' || m_charToken == L'%')
        return 3;
    else if (m_charToken == L')' || m_charToken == L'(')
    {
        if (m_braceType == BraceType::Priority || m_braceType == BraceType::Unassigned)
            return 0;
        else
            return 4;
    }
    return -1;
}